

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O3

void HBLAS2::hblas2_ger_square<std::complex<double>,true>(void)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  pointer pqVar15;
  quaternion<double> *__cur;
  void *__s;
  quaternion<double> *X;
  long lVar16;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  quaternion<double> *pqVar17;
  long lVar18;
  quaternion<double> *x;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  complex<double> ALPHA;
  quaternion<double> *in_stack_fffffffffffffd28;
  double dVar109;
  double dVar110;
  double local_298;
  double local_278;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_260;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> AC;
  undefined1 local_230 [8];
  undefined8 local_228;
  shared_count sStack_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined **local_1d8;
  undefined1 local_1d0;
  undefined8 *local_1c8;
  char **local_1c0;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  undefined1 auVar37 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar51 [32];
  undefined1 auVar65 [32];
  undefined1 auVar76 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  
  __s = operator_new(0xc80);
  memset(__s,0,0xc80);
  X = (quaternion<double> *)operator_new(0xc80);
  memset(X,0,0xc80);
  local_260.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(320000);
  pqVar17 = local_260.
            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 10000;
  local_260.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pqVar17;
  memset(local_260.
         super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start,0,320000);
  lVar19 = 0x18;
  local_260.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pqVar17;
  do {
    dVar23 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar27 = _ZL3dis_1;
    dVar1 = _ZL3dis_0;
    dVar24 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar2 = _ZL3dis_0;
    dVar109 = _ZL3dis_1;
    dVar25 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar28 = _ZL3dis_1;
    dVar13 = _ZL3dis_0;
    auVar38._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    dVar110 = _ZL3dis_0;
    auVar38._8_56_ = extraout_var;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar1;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar2;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = dVar13;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = _ZL3dis_0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar23;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar27 - dVar1;
    auVar3 = vfmadd132sd_fma(auVar41,auVar56,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar24;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar109 - dVar2;
    auVar4 = vfmadd132sd_fma(auVar57,auVar67,auVar4);
    *(long *)((long)__s + lVar19 + -0x18) = auVar3._0_8_;
    dVar1 = _ZL3dis_1;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar25;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = dVar28 - dVar13;
    auVar3 = vfmadd132sd_fma(auVar68,auVar78,auVar21);
    *(long *)((long)__s + lVar19 + -0x10) = auVar4._0_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = dVar1 - dVar110;
    auVar4 = vfmadd213sd_fma(auVar79,auVar38._0_16_,auVar89);
    *(long *)((long)__s + lVar19 + -8) = auVar3._0_8_;
    *(long *)((long)__s + lVar19) = auVar4._0_8_;
    lVar19 = lVar19 + 0x20;
  } while (lVar19 != 0xc98);
  lVar19 = 0x18;
  do {
    dVar23 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar27 = _ZL3dis_1;
    dVar1 = _ZL3dis_0;
    dVar24 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar2 = _ZL3dis_0;
    dVar109 = _ZL3dis_1;
    dVar25 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar28 = _ZL3dis_1;
    dVar13 = _ZL3dis_0;
    auVar39._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    pqVar15 = local_260.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    dVar110 = _ZL3dis_0;
    auVar39._8_56_ = extraout_var_00;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar1;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar2;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = dVar13;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = _ZL3dis_0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar23;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar27 - dVar1;
    auVar3 = vfmadd132sd_fma(auVar42,auVar58,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar24;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = dVar109 - dVar2;
    auVar4 = vfmadd132sd_fma(auVar59,auVar69,auVar6);
    *(long *)((long)X + lVar19 + -0x18) = auVar3._0_8_;
    dVar1 = _ZL3dis_1;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar25;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = dVar28 - dVar13;
    auVar3 = vfmadd132sd_fma(auVar70,auVar80,auVar7);
    *(long *)((long)X + lVar19 + -0x10) = auVar4._0_8_;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = dVar1 - dVar110;
    auVar4 = vfmadd213sd_fma(auVar81,auVar39._0_16_,auVar90);
    *(long *)((long)X + lVar19 + -8) = auVar3._0_8_;
    *(long *)((long)&X->_M_real + lVar19) = auVar4._0_8_;
    lVar19 = lVar19 + 0x20;
    pqVar17 = local_260.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  } while (lVar19 != 0xc98);
  for (; pqVar17 != pqVar15; pqVar17 = pqVar17 + 1) {
    dVar24 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar27 = _ZL3dis_1;
    dVar1 = _ZL3dis_0;
    dVar25 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar2 = _ZL3dis_0;
    dVar23 = _ZL3dis_1;
    dVar26 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    dVar28 = _ZL3dis_1;
    dVar13 = _ZL3dis_0;
    auVar40._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    dVar109 = _ZL3dis_1;
    dVar110 = _ZL3dis_0;
    auVar40._8_56_ = extraout_var_01;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = dVar1;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar2;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = dVar13;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = _ZL3dis_0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar24;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar27 - dVar1;
    auVar3 = vfmadd132sd_fma(auVar43,auVar60,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar25;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar23 - dVar2;
    auVar4 = vfmadd132sd_fma(auVar61,auVar71,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar26;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar28 - dVar13;
    auVar21 = vfmadd132sd_fma(auVar72,auVar82,auVar10);
    pqVar17->_M_real = auVar3._0_8_;
    pqVar17->_M_imag_i = auVar4._0_8_;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = dVar109 - dVar110;
    auVar3 = vfmadd213sd_fma(auVar83,auVar40._0_16_,auVar91);
    pqVar17->_M_imag_j = auVar21._0_8_;
    pqVar17->_M_imag_k = auVar3._0_8_;
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&AC,&local_260);
  dVar27 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  dVar13 = _ZL3dis_1;
  dVar1 = _ZL3dis_0;
  dVar28 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  dVar2 = _ZL3dis_0;
  dVar110 = _ZL3dis_1;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"hblas2_ger ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"c",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"_square_",8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"C",1);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar1;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar27;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar13 - dVar1;
  auVar3 = vfmadd132sd_fma(auVar29,auVar44,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar28;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar110 - dVar2;
  auVar4 = vfmadd132sd_fma(auVar45,auVar73,auVar12);
  ALPHA._M_value._8_8_ = 1;
  ALPHA._M_value._0_8_ = __s;
  HAXX::HBLAS_GERC<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>>
            (100,100,ALPHA,X,1,
             local_260.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,100,in_stack_fffffffffffffd28,
             SUB84(dVar110,0));
  lVar19 = 0x18;
  lVar18 = 0;
  auVar14._8_8_ = 0x8000000000000000;
  auVar14._0_8_ = 0x8000000000000000;
  auVar21 = vxorpd_avx512vl(auVar4,auVar14);
  do {
    pqVar17 = X + lVar18;
    lVar20 = 0x18;
    lVar16 = lVar19;
    do {
      local_1e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
      local_1e0 = "";
      local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0xf5,&local_1f8);
      local_278 = auVar21._0_8_;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = auVar3._0_8_;
      local_298 = auVar4._0_8_;
      dVar1 = pqVar17->_M_real;
      auVar102._8_8_ = dVar1;
      auVar102._0_8_ = dVar1;
      auVar105._16_8_ = dVar1;
      auVar105._0_16_ = auVar102;
      auVar105._24_8_ = dVar1;
      dVar1 = *(double *)((long)__s + lVar20 + -0x10);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar1;
      dVar2 = *(double *)((long)__s + lVar20 + -0x18);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar2;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = *(double *)((long)__s + lVar20);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = dVar1 * local_278;
      auVar41 = vfmadd231sd_fma(auVar62,auVar95,auVar30);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_298 * dVar2;
      auVar56 = vfmadd231sd_fma(auVar31,auVar95,auVar46);
      dVar1 = *(double *)((long)__s + lVar20 + -8);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar1;
      auVar63._0_8_ = auVar41._0_8_;
      auVar63._8_8_ = auVar63._0_8_;
      auVar65._16_8_ = auVar63._0_8_;
      auVar65._0_16_ = auVar63;
      auVar65._24_8_ = auVar63._0_8_;
      auVar32._0_8_ = auVar56._0_8_;
      auVar32._8_8_ = auVar32._0_8_;
      auVar41 = vunpcklpd_avx(auVar63,auVar32);
      auVar84._8_8_ = 0;
      auVar84._0_8_ = *(double *)((long)__s + lVar20) * local_278;
      auVar56 = vfmadd231sd_fma(auVar84,auVar95,auVar47);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_298 * dVar1;
      auVar57 = vfmadd231sd_fma(auVar48,auVar95,auVar74);
      auVar85._0_8_ = auVar56._0_8_;
      auVar85._8_8_ = auVar85._0_8_;
      auVar94._16_16_ = auVar85;
      auVar94._0_16_ = auVar41;
      auVar49._0_8_ = auVar57._0_8_;
      auVar49._8_8_ = auVar49._0_8_;
      auVar51._16_8_ = auVar49._0_8_;
      auVar51._0_16_ = auVar49;
      auVar51._24_8_ = auVar49._0_8_;
      auVar100._0_8_ = -pqVar17->_M_imag_k;
      auVar51 = vblendpd_avx(auVar94,auVar51,8);
      auVar100._8_8_ = auVar100._0_8_;
      auVar100._16_8_ = auVar100._0_8_;
      auVar100._24_8_ = auVar100._0_8_;
      auVar41 = vunpckhpd_avx(auVar49,auVar32);
      auVar22 = vshufpd_avx(auVar51,auVar51,0xb);
      auVar36._16_16_ = auVar41;
      auVar36._0_16_ = auVar85;
      auVar96._0_8_ = -pqVar17->_M_imag_j;
      auVar96._8_8_ = 0x8000000000000000;
      auVar92._0_8_ = -pqVar17->_M_imag_i;
      auVar92._8_8_ = 0x8000000000000000;
      auVar41 = vunpcklpd_avx(auVar102,auVar92);
      auVar54 = vblendpd_avx(auVar105,ZEXT1632(auVar92),1);
      auVar56 = vunpcklpd_avx(auVar92,auVar96);
      auVar108._16_16_ = auVar96;
      auVar108._0_16_ = auVar41;
      auVar52._0_8_ = auVar22._0_8_ * auVar54._0_8_;
      auVar52._8_8_ = auVar22._8_8_ * auVar54._8_8_;
      auVar52._16_8_ = auVar22._16_8_ * auVar54._16_8_;
      auVar52._24_8_ = auVar22._24_8_ * auVar54._24_8_;
      auVar54 = vblendpd_avx(auVar108,auVar100,8);
      auVar87._16_16_ = auVar56;
      auVar87._0_16_ = auVar54._16_16_;
      auVar41 = vfmadd231pd_fma(auVar52,auVar36,auVar87);
      auVar51 = vpermpd_avx2(auVar51,0x9f);
      auVar22 = vpermt2pd_avx512f(_DAT_002447c0,ZEXT1632(auVar92));
      auVar53._0_8_ = auVar22._0_8_ * auVar51._0_8_;
      auVar53._8_8_ = auVar22._8_8_ * auVar51._8_8_;
      auVar53._16_8_ = auVar22._16_8_ * auVar51._16_8_;
      auVar53._24_8_ = auVar22._24_8_ * auVar51._24_8_;
      auVar56 = vfmsub231pd_fma(auVar53,auVar65,auVar54);
      auVar33._0_8_ = auVar56._0_8_ + -auVar41._0_8_;
      auVar33._8_8_ = auVar56._8_8_ + auVar41._8_8_;
      dVar1 = auVar33._0_8_ +
              *(double *)
               ((long)AC.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x18);
      auVar41 = vshufpd_avx(auVar33,auVar33,1);
      dVar2 = auVar41._0_8_ +
              *(double *)
               ((long)AC.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x10);
      dVar13 = *(double *)
                ((long)AC.
                       super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8) + 0.0;
      auVar34._8_8_ = dVar1;
      auVar34._0_8_ = dVar1;
      auVar37._16_8_ = dVar1;
      auVar37._0_16_ = auVar34;
      auVar37._24_8_ = dVar1;
      auVar93._8_8_ = dVar2;
      auVar93._0_8_ = dVar2;
      auVar41 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
      dVar27 = auVar41._0_8_ +
               *(double *)
                ((long)&(AC.
                         super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar16);
      auVar86._8_8_ = dVar13;
      auVar86._0_8_ = dVar13;
      auVar41 = vunpcklpd_avx(auVar34,auVar93);
      auVar54._16_16_ = auVar86;
      auVar54._0_16_ = auVar41;
      dVar1 = *(double *)
               ((long)local_260.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x18);
      dVar2 = *(double *)
               ((long)local_260.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x10);
      auVar97._8_8_ = 0;
      auVar97._0_8_ = dVar2;
      dVar13 = *(double *)
                ((long)local_260.
                       super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = dVar13;
      dVar110 = *(double *)
                 ((long)&(local_260.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar16);
      auVar107._8_8_ = 0;
      auVar107._0_8_ = dVar110;
      local_1d0 = 0;
      local_218 = 
      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
      local_210 = "";
      auVar64._8_8_ = dVar27;
      auVar64._0_8_ = dVar27;
      auVar22._16_8_ = dVar27;
      auVar22._0_16_ = auVar64;
      auVar22._24_8_ = dVar27;
      auVar51 = vblendpd_avx(auVar54,auVar22,8);
      auVar41 = vunpckhpd_avx(auVar64,auVar93);
      auVar66._16_16_ = auVar41;
      auVar66._0_16_ = auVar86;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = dVar1 * dVar1;
      auVar41 = vfmadd231sd_fma(auVar99,auVar97,auVar97);
      auVar41 = vfmadd231sd_fma(auVar41,auVar103,auVar103);
      auVar41 = vfmadd231sd_fma(auVar41,auVar107,auVar107);
      auVar41 = vsqrtsd_avx(auVar41,auVar41);
      dVar27 = auVar41._0_8_;
      auVar75._0_8_ = (dVar1 / dVar27) / dVar27;
      auVar104._0_8_ = (-dVar13 / dVar27) / dVar27;
      auVar98._0_8_ = (-dVar2 / dVar27) / dVar27;
      auVar98._8_8_ = 0x8000000000000000;
      auVar101._0_8_ = (-dVar110 / dVar27) / dVar27;
      auVar75._8_8_ = auVar75._0_8_;
      auVar76._16_8_ = auVar75._0_8_;
      auVar76._0_16_ = auVar75;
      auVar76._24_8_ = auVar75._0_8_;
      auVar104._8_8_ = auVar104._0_8_;
      auVar106._16_8_ = auVar104._0_8_;
      auVar106._0_16_ = auVar104;
      auVar106._24_8_ = auVar104._0_8_;
      auVar101._8_8_ = auVar101._0_8_;
      auVar101._16_8_ = auVar101._0_8_;
      auVar101._24_8_ = auVar101._0_8_;
      auVar41 = vunpcklpd_avx(auVar75,auVar98);
      auVar56 = vunpcklpd_avx(auVar98,auVar75);
      auVar54 = vblendpd_avx(ZEXT1632(auVar41),auVar106,4);
      auVar22 = vblendpd_avx(ZEXT1632(auVar56),auVar76,0xc);
      auVar41 = vunpcklpd_avx(auVar98,auVar104);
      auVar54 = vblendpd_avx(auVar54,auVar101,8);
      auVar36 = vshufpd_avx(auVar51,auVar51,0xb);
      auVar51 = vpermpd_avx2(auVar51,0x9f);
      auVar77._0_8_ = auVar36._0_8_ * auVar22._0_8_;
      auVar77._8_8_ = auVar36._8_8_ * auVar22._8_8_;
      auVar77._16_8_ = auVar36._16_8_ * auVar22._16_8_;
      auVar77._24_8_ = auVar36._24_8_ * auVar22._24_8_;
      auVar88._16_16_ = auVar41;
      auVar88._0_16_ = auVar54._16_16_;
      auVar41 = vfmadd231pd_fma(auVar77,auVar66,auVar88);
      auVar22 = vpermt2pd_avx512f(_DAT_002447c0,ZEXT1632(auVar98));
      auVar55._0_8_ = auVar22._0_8_ * auVar51._0_8_;
      auVar55._8_8_ = auVar22._8_8_ * auVar51._8_8_;
      auVar55._16_8_ = auVar22._16_8_ * auVar51._16_8_;
      auVar55._24_8_ = auVar22._24_8_ * auVar51._24_8_;
      auVar56 = vfmsub231pd_fma(auVar55,auVar37,auVar54);
      auVar35._0_8_ = auVar56._0_8_ + -auVar41._0_8_;
      auVar35._8_8_ = auVar56._8_8_ + auVar41._8_8_;
      auVar41 = vshufpd_avx(auVar35,auVar35,1);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = (auVar35._0_8_ + -1.0) * (auVar35._0_8_ + -1.0);
      auVar41 = vfmadd213sd_fma(auVar41,auVar41,auVar50);
      auVar56 = vfmadd231sd_fma(auVar41,(undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar41 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
      auVar41 = vfmadd213sd_fma(auVar41,auVar41,auVar56);
      auVar41 = vsqrtsd_avx(auVar41,auVar41);
      local_230[0] = auVar41._0_8_ < 1e-12;
      local_228 = 0;
      sStack_220.pi_ = (sp_counted_base *)0x0;
      local_208 = 
      "( HAXX::norm(((ALPHA*X[i]*HAXX::conj(Y[j]) + AC[( (i) + (j)*(100) )]) * HAXX::inv(A[( (i) + (j)*(100) )]))- 1.) < 1e-12 )"
      ;
      local_200 = "";
      local_1d8 = &PTR__lazy_ostream_002658f0;
      local_1c8 = &boost::unit_test::lazy_ostream::inst;
      local_1c0 = &local_208;
      boost::test_tools::tt_detail::report_assertion(local_230,&local_1d8,&local_218,0xf5,1,0,0);
      boost::detail::shared_count::~shared_count(&sStack_220);
      lVar16 = lVar16 + 0x20;
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0xc98);
    lVar18 = lVar18 + 1;
    lVar19 = lVar19 + 0xc80;
  } while (lVar18 != 100);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
  if (AC.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(AC.
                    super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)AC.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)AC.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_260.
      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (quaternion<double> *)0x0) {
    operator_delete(local_260.
                    super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_260.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_260.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(X,0xc80);
  operator_delete(__s,0xc80);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(hblas2_gemv_square_CQR_LDSame) {
  hblas2_gemv_square_LDSame<HAXX::quaternion<double>,double,'C'>(); 
}